

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O2

void __thiscall
vmtz_rule::resolve(vmtz_rule *this,int32_t *dayno,int32_t *daytime,int year,vmtz_rule *prev_rule)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  caldate_t local_34;
  
  local_34.m = (int)this->mm;
  local_34.d = 0;
  local_34.y = year;
  switch(this->when) {
  case '\0':
    local_34.d = (int)this->dd;
    break;
  case '\x01':
    local_34.m = local_34.m + 1;
    iVar2 = caldate_t::weekday(&local_34);
    iVar4 = (iVar2 - this->weekday) + 1;
    iVar2 = (iVar2 - this->weekday) + 8;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    local_34.d = local_34.d - iVar2;
    break;
  case '\x02':
    local_34.d = (int)this->dd;
    uVar1 = caldate_t::weekday(&local_34);
    iVar4 = (int)this->weekday + ~uVar1;
    iVar2 = (int)this->weekday + ~uVar1 + 7;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    local_34.d = iVar2 + local_34.d;
    break;
  case '\x03':
    local_34.d = (int)this->dd;
    uVar1 = caldate_t::weekday(&local_34);
    iVar4 = (int)this->weekday + ~uVar1;
    iVar2 = (int)this->weekday + ~uVar1 + 7;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    local_34.d = local_34.d + iVar2 + -7;
  }
  iVar3 = caldate_t::dayno(&local_34);
  *dayno = iVar3;
  iVar2 = this->at;
  *daytime = iVar2;
  if (this->at_zone == '@') {
    iVar4 = prev_rule->gmtofs;
  }
  else {
    if (this->at_zone != '\0') goto LAB_00252579;
    iVar4 = prev_rule->gmtofs + prev_rule->save;
  }
  *daytime = iVar2 - iVar4;
LAB_00252579:
  caldate_t::normalize(dayno,daytime);
  return;
}

Assistant:

void vmtz_rule::resolve(int32_t &dayno, int32_t &daytime, int year,
                        const vmtz_rule *prev_rule)
{
    /* set up our year and month; we have yet to work out the day */
    int w, delta;
    caldate_t cd(year, mm, 0);

    /* figure out the day according to our type */
    switch (when)
    {
    case 0:
        /* the rule takes effect on a the fixed day 'dd' */
        cd.d = dd;
        break;

    case 1:
        /* 
         *   The rule takes effect on the last <weekday> of the month.  Get
         *   the weekday of the last day of this month (which we can figure
         *   using day 0 of next month). 
         */
        cd.m += 1;
        w = cd.weekday() + 1;

        /* figure the days from mm/last to the previous target weekday */
        delta = w - weekday;
        if (delta < 0)
            delta += 7;

        /* go back that many days */
        cd.d -= delta;
        break;

    case 2:
        /* first <weekday> on or after <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure days between <dd> and the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days */
        cd.d += delta;
        break;

    case 3:
        /* first <weekday> on or before <dd> - get the weekday of <dd> */
        cd.d = dd;
        w = cd.weekday() + 1;

        /* figure the days from <dd> to the next <weekday> */
        delta = weekday - w;
        if (delta < 0)
            delta += 7;

        /* go ahead that many days and back a week */
        cd.d += delta - 7;
        break;
    }

    /* we now have our effective date and time */
    dayno = cd.dayno();
    daytime = at;

    /* adjust the time zone */
    switch (at_zone)
    {
    case 0x80:
        /* the rule was stated in UTC, which is what we're after */
        break;

    case 0x00:
        /* 
         *   The rule was stated in local wall clock time, in the period in
         *   effect just before the rule.  That means we use the zone
         *   settings of the *previous* rule, which defines the period
         *   leading up to this rule's firing time.  Convert to UTC by
         *   subtracting the standard time offset plus the daylight offset
         *   for the prior period.
         */
        daytime -= prev_rule->gmtofs + prev_rule->save;
        break;

    case 0x40:
        /* 
         *   the rule was stated in local standard time, so subtract the
         *   standard time offset for the prior period 
         */
        daytime -= prev_rule->gmtofs;
        break;
    }

    /* normalize the time to keep it within 0-23:59:59 */
    caldate_t::normalize(dayno, daytime);
}